

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie_test.cc
# Opt level: O0

void hbtrie_key_test(void)

{
  uint uVar1;
  int keylen;
  char buf [256];
  char *key [6];
  int j;
  int i;
  hbtrie trie;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  byte local_1f8 [8];
  void *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe1c;
  void *in_stack_fffffffffffffe20;
  hbtrie *in_stack_fffffffffffffe28;
  undefined8 local_f8 [6];
  int local_c8;
  int local_c4;
  undefined1 local_c0;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_c0 = 4;
  memcpy(local_f8,&DAT_00156c70,0x30);
  for (local_c4 = 0; local_c4 < 6; local_c4 = local_c4 + 1) {
    strlen((char *)local_f8[local_c4]);
    uVar1 = _hbtrie_reform_key(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                               in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10);
    printf("keylen: %2d , ",(ulong)uVar1);
    for (local_c8 = 0; local_c8 < (int)uVar1; local_c8 = local_c8 + 1) {
      printf("%02x ",(ulong)local_1f8[local_c8]);
    }
    printf("\n");
  }
  if (hbtrie_key_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","hbtrie key test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","hbtrie key test");
  }
  return;
}

Assistant:

void hbtrie_key_test()
{
    TEST_INIT();

    struct hbtrie trie;
    int i,j;

    trie.chunksize = 4;

    const char *key[] = {"abc", "abcd", "abcde", "abcdef", "abcdefg", "abcdefgh"};
    char buf[256];
    int keylen;

    for (i=0;i<6;++i){
        keylen = _hbtrie_reform_key(&trie, (void*)key[i], strlen(key[i]), (void*)buf);

        DBG("keylen: %2d , ", keylen);
        for (j=0;j<keylen;++j) {
            printf("%02x ", (uint8_t)buf[j]);
        }
        printf("\n");
    }

    TEST_RESULT("hbtrie key test");
}